

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O1

void __thiscall Firework::applyForce(Firework *this,vec2 force)

{
  float fVar1;
  Particle *pPVar2;
  Particle *particle;
  Particle *this_00;
  
  if (this->exploded != false) {
    pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
                   .super__Vector_impl_data._M_start; this_00 != pPVar2; this_00 = this_00 + 1) {
      Particle::applyForce(this_00,force);
    }
    return;
  }
  fVar1 = (this->rocket).mass;
  (this->rocket).acceleration.field_0.field_0.x =
       force.field_0._0_4_ * fVar1 + (this->rocket).acceleration.field_0.field_0.x;
  (this->rocket).acceleration.field_0.field_0.y =
       force.field_0._4_4_ * fVar1 + (this->rocket).acceleration.field_0.field_0.y;
  return;
}

Assistant:

void Firework::applyForce(glm::vec2 force) {
    if (!exploded) {
        rocket.applyForce(force);
    } else {
        for (Particle& particle : particles) {
            particle.applyForce(force);
        }
    }
}